

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall FpgaIO::WaitRTL8211F_Idle(FpgaIO *this,char *callerName,uint chan,uint loop_cnt)

{
  BasePort *pBVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  quadlet_t read_data;
  uint local_3c;
  char *local_38;
  
  local_38 = callerName;
  Amp1394_Sleep(0.001);
  bVar4 = false;
  while( true ) {
    if (bVar4 != false) {
      return bVar4;
    }
    bVar4 = loop_cnt == 0;
    loop_cnt = loop_cnt - 1;
    if (bVar4) break;
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,(ulong)(chan << 8 | 0x40a0),
                       &local_3c);
    bVar4 = (bool)((local_3c & 0x7000000) == 0 & (byte)iVar2);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,local_38);
  poVar3 = std::operator<<(poVar3," timeout waiting for idle, cnt ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", read ");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool FpgaIO::WaitRTL8211F_Idle(const char *callerName, unsigned int chan, unsigned int loop_cnt)
{
    // Should have firmware/hardware checks
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, check up to loop_cnt iterations
    nodeaddr_t address = 0x40a0 | (chan << 8);
    quadlet_t read_data;
    bool isIdle = false;
    unsigned int i = 0;
    while (!isIdle && (i++ < loop_cnt)) {
        if (port->ReadQuadlet(BoardId, address, read_data))
            isIdle = ((read_data&0x07000000) == 0);
    }
    if (!isIdle) {
        std::cout << callerName << " timeout waiting for idle, cnt " << i << ", read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    return isIdle;
}